

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetPSTATPartNumber(ndicapi *pol,int port,char *part)

{
  char (*__src) [20];
  
  if (port - 0x31U < 3) {
    __src = pol->PstatPartNumber + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 3;
    }
    __src = pol->PstatPassivePartNumber + (port - 0x41U);
  }
  if ((*__src)[0] != '\0') {
    strncpy(part,*__src,0x14);
    return 0;
  }
  return 3;
}

Assistant:

ndicapiExport int ndiGetPSTATPartNumber(ndicapi* pol, int port, char part[20])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatPartNumber[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassivePartNumber[port - 'A'];
  }
  else
  {
    return NDI_UNOCCUPIED;
  }

  if (*dp == '\0')
  {
    return NDI_UNOCCUPIED;
  }

  strncpy(part, dp, 20);

  return NDI_OKAY;
}